

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_long>::test_many<(libdivide::Branching)1>
          (DivideTest<unsigned_long> *this,unsigned_long denom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  divider<unsigned_long,_(libdivide::Branching)1> *pdVar3;
  divider<unsigned_long,_(libdivide::Branching)1> *pdVar4;
  divider<unsigned_long,_(libdivide::Branching)1> *in_RSI;
  DivideTest<unsigned_long> *in_RDI;
  unsigned_long recovered;
  divider<unsigned_long,_(libdivide::Branching)1> the_divider;
  libdivide_u64_t tmp;
  libdivide_u64_branchfree_t ret;
  uint64_t twice_rem;
  uint64_t e;
  uint8_t more;
  uint64_t rem;
  uint64_t proposed_m;
  uint32_t floor_log_2_d;
  libdivide_u64_t result;
  uint64_t result_1;
  divider<unsigned_long,_(libdivide::Branching)1> *in_stack_fffffffffffffe80;
  ostream *poVar5;
  unsigned_long in_stack_fffffffffffffe88;
  string *psVar6;
  DivideTest<unsigned_long> *in_stack_fffffffffffffe90;
  DivideTest<unsigned_long> **denom_00;
  DivideTest<unsigned_long> *in_stack_fffffffffffffea8;
  DivideTest<unsigned_long> *in_stack_fffffffffffffeb0;
  string local_148 [32];
  divider<unsigned_long,_(libdivide::Branching)1> *local_128;
  DivideTest<unsigned_long> *local_119;
  byte local_111;
  divider<unsigned_long,_(libdivide::Branching)1> *local_110;
  DivideTest<unsigned_long> **local_f8;
  DivideTest<unsigned_long> *local_f0;
  byte local_e8;
  DivideTest<unsigned_long> **denom_01;
  DivideTest<unsigned_long> *this_00;
  DivideTest<unsigned_long> local_60;
  int local_50;
  undefined4 local_4c;
  DivideTest<unsigned_long> *local_39;
  byte local_31;
  undefined8 local_28;
  DivideTest<unsigned_long> *local_20;
  undefined8 local_10;
  ulong local_8;
  
  if (in_RSI != (divider<unsigned_long,_(libdivide::Branching)1> *)0x1) {
    denom_00 = &local_119;
    local_f8 = denom_00;
    if (in_RSI == (divider<unsigned_long,_(libdivide::Branching)1> *)0x1) {
      fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x484,"libdivide_u64_branchfree_gen",
              "branchfree divider must be != 1");
      abort();
    }
    local_4c = 1;
    if (in_RSI == (divider<unsigned_long,_(libdivide::Branching)1> *)0x0) {
      fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x44c,"libdivide_internal_u64_gen",
              "divider must be != 0");
      abort();
    }
    local_50 = 0x3f - (int)LZCOUNT(in_RSI);
    local_31 = (byte)local_50;
    if (((ulong)in_RSI & (ulong)&in_RSI[-1].div.denom.more) == 0) {
      local_39 = (DivideTest<unsigned_long> *)0x0;
      local_31 = local_31 - 1;
    }
    else {
      local_8 = 1L << (local_31 & 0x3f);
      local_10 = 0;
      in_stack_fffffffffffffe90 = &local_60;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_8;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      local_28 = 0;
      pdVar4 = SUB168((auVar2 << 0x40) % auVar1,0);
      local_60.rand_n = 0;
      pdVar3 = (divider<unsigned_long,_(libdivide::Branching)1> *)((long)pdVar4 * 2);
      if ((in_RSI <= pdVar3) || (pdVar3 < pdVar4)) {
        local_60.rand_n = 1;
      }
      local_31 = local_31 | 0x40;
      local_39 = (DivideTest<unsigned_long> *)(local_60.rand_n + 1);
      local_20 = in_stack_fffffffffffffe90;
    }
    local_e8 = local_31 & 0x3f;
    local_f0 = local_39;
    local_119 = local_39;
    local_110 = in_RSI;
    denom_01 = denom_00;
    this_00 = local_39;
    local_111 = local_e8;
    local_128 = (divider<unsigned_long,_(libdivide::Branching)1> *)
                libdivide::divider<unsigned_long,_(libdivide::Branching)1>::recover
                          (in_stack_fffffffffffffe80);
    if (local_128 != local_110) {
      poVar5 = (ostream *)&std::cerr;
      std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
      psVar6 = local_148;
      testcase_name_abi_cxx11_(in_stack_fffffffffffffea8,(int)((ulong)in_RDI >> 0x20));
      std::operator<<(poVar5,psVar6);
      std::__cxx11::string::~string(local_148);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,(ulong)local_110);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,(ulong)local_128);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
    test_edgecase_numerators<(libdivide::Branching)1>
              (in_stack_fffffffffffffeb0,(unsigned_long)in_stack_fffffffffffffea8,
               (divider<unsigned_long,_(libdivide::Branching)1> *)in_RDI);
    test_small_numerators<(libdivide::Branching)1>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    test_pow2_numerators<(libdivide::Branching)1>
              (in_RDI,(unsigned_long)denom_00,
               (divider<unsigned_long,_(libdivide::Branching)1> *)in_stack_fffffffffffffe90);
    test_allbits_numerators<(libdivide::Branching)1>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    test_random_numerators<(libdivide::Branching)1>
              (in_RDI,(unsigned_long)denom_00,
               (divider<unsigned_long,_(libdivide::Branching)1> *)in_stack_fffffffffffffe90);
    test_vectordivide_numerators<(libdivide::Branching)1>(this_00,(unsigned_long)denom_01,in_RSI);
  }
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }